

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O0

void phits2mcpl_parse_args
               (int argc,char **argv,char **infile,char **outfile,char **cfgfile,
               char **dumpsummaryfile,int *double_prec,int *do_gzip)

{
  int iVar1;
  void *__ptr;
  long *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  long *in_R8;
  long *in_R9;
  char *progname;
  undefined4 *in_stack_00000010;
  int i;
  int local_34;
  
  *in_R8 = 0;
  *in_R9 = 0;
  *in_RDX = 0;
  *in_RCX = 0;
  progname[0] = '\0';
  progname[1] = '\0';
  progname[2] = '\0';
  progname[3] = '\0';
  *in_stack_00000010 = 1;
  for (local_34 = 1; local_34 < in_EDI; local_34 = local_34 + 1) {
    if (*(char *)in_RSI[local_34] != '\0') {
      iVar1 = strcmp((char *)in_RSI[local_34],"-h");
      if ((iVar1 == 0) || (iVar1 = strcmp((char *)in_RSI[local_34],"--help"), iVar1 == 0)) {
        __ptr = (void *)mcpl_usage_progname(*in_RSI);
        printf("Usage:\n\n");
        printf("  %s [options] dumpfile [output.mcpl]\n\n",__ptr);
        printf(
              "Converts the Monte Carlo particles in the input dump file (binary PHITS dump\nfile format in suitable configuration) to MCPL format and stores in the\ndesignated output file (defaults to \"output.mcpl\").\n\nOptions:\n\n  -h, --help   : Show this usage information.\n  -d, --double : Enable double-precision storage of floating point values.\n  -n, --nogzip : Do not attempt to gzip output file.\n  -c FILE      : Embed entire configuration FILE (the input deck)\n                 used to produce dumpfile in the MCPL header.\n  -s FILE      : Embed into the MCPL header the dump summary text file,\n                 which was produced along with the dumpfile itself.\n"
              );
        free(__ptr);
        exit(0);
      }
      iVar1 = strcmp((char *)in_RSI[local_34],"-c");
      if (iVar1 == 0) {
        if ((local_34 + 1 == in_EDI) || (*(char *)in_RSI[local_34 + 1] == '-')) {
          printf("Error: Missing argument for -c\n");
          exit(1);
        }
        local_34 = local_34 + 1;
        if (*in_R8 != 0) {
          printf("Error: -c specified more than once\n");
          exit(1);
        }
        *in_R8 = in_RSI[local_34];
      }
      else {
        iVar1 = strcmp((char *)in_RSI[local_34],"-s");
        if (iVar1 == 0) {
          if ((local_34 + 1 == in_EDI) || (*(char *)in_RSI[local_34 + 1] == '-')) {
            printf("Error: Missing argument for -s\n");
            exit(1);
          }
          local_34 = local_34 + 1;
          if (*in_R9 != 0) {
            printf("Error: -s specified more than once\n");
            exit(1);
          }
          *in_R9 = in_RSI[local_34];
        }
        else {
          iVar1 = strcmp((char *)in_RSI[local_34],"-d");
          if ((iVar1 == 0) || (iVar1 = strcmp((char *)in_RSI[local_34],"--double"), iVar1 == 0)) {
            progname[0] = '\x01';
            progname[1] = '\0';
            progname[2] = '\0';
            progname[3] = '\0';
          }
          else {
            iVar1 = strcmp((char *)in_RSI[local_34],"-n");
            if ((iVar1 == 0) || (iVar1 = strcmp((char *)in_RSI[local_34],"--nogzip"), iVar1 == 0)) {
              *in_stack_00000010 = 0;
            }
            else {
              if (*(char *)in_RSI[local_34] == '-') {
                printf("Error: Unknown argument: %s\n",in_RSI[local_34]);
                exit(1);
              }
              if (*in_RDX == 0) {
                *in_RDX = in_RSI[local_34];
              }
              else {
                if (*in_RCX != 0) {
                  printf(
                        "Error: Too many arguments! (run with -h or --help for usage instructions)\n"
                        );
                  exit(1);
                }
                *in_RCX = in_RSI[local_34];
              }
            }
          }
        }
      }
    }
  }
  if (*in_RDX == 0) {
    printf("Error: Too few arguments! (run with -h or --help for usage instructions)\n");
    exit(1);
  }
  if (*in_RCX == 0) {
    *in_RCX = (long)"output.mcpl";
  }
  iVar1 = strcmp((char *)*in_RDX,(char *)*in_RCX);
  if (iVar1 != 0) {
    return;
  }
  printf("Error: input and output files are identical.\n");
  exit(1);
}

Assistant:

void phits2mcpl_parse_args( int argc,char **argv, const char** infile,
                            const char **outfile,  const char **cfgfile,
                            const char **dumpsummaryfile,
                            int* double_prec, int* do_gzip ) {
  *cfgfile = 0;
  *dumpsummaryfile = 0;
  *infile = 0;
  *outfile = 0;
  *double_prec = 0;
  *do_gzip = 1;
  int i;
  for (i=1; i < argc; ++i) {
    if (argv[i][0]=='\0')
      continue;
    if (strcmp(argv[i],"-h")==0||strcmp(argv[i],"--help")==0) {
      char * progname = mcpl_usage_progname(argv[0]);
      printf("Usage:\n\n");
      printf("  %s [options] dumpfile [output.mcpl]\n\n",progname);
      printf("Converts the Monte Carlo particles in the input dump file (binary PHITS dump\n"
             "file format in suitable configuration) to MCPL format and stores in the\n"
             "designated output file (defaults to \"output.mcpl\").\n"
             "\n"
             "Options:\n"
             "\n"
             "  -h, --help   : Show this usage information.\n"
             "  -d, --double : Enable double-precision storage of floating point values.\n"
             "  -n, --nogzip : Do not attempt to gzip output file.\n"
             "  -c FILE      : Embed entire configuration FILE (the input deck)\n"
             "                 used to produce dumpfile in the MCPL header.\n"
             "  -s FILE      : Embed into the MCPL header the dump summary text file,\n"
             "                 which was produced along with the dumpfile itself.\n"
             );
      free(progname);
      exit(0);
    }
    if (strcmp(argv[i],"-c")==0) {
      if (i+1==argc||argv[i+1][0]=='-') {
        printf("Error: Missing argument for -c\n");
        exit(1);
      }
      ++i;
      if (*cfgfile) {
        printf("Error: -c specified more than once\n");
        exit(1);
      }
      *cfgfile = argv[i];
      continue;
    }
    if (strcmp(argv[i],"-s")==0) {
      if (i+1==argc||argv[i+1][0]=='-') {
        printf("Error: Missing argument for -s\n");
        exit(1);
      }
      ++i;
      if (*dumpsummaryfile) {
        printf("Error: -s specified more than once\n");
        exit(1);
      }
      *dumpsummaryfile = argv[i];
      continue;
    }

    if (strcmp(argv[i],"-d")==0||strcmp(argv[i],"--double")==0) {
      *double_prec = 1;
      continue;
    }
    if (strcmp(argv[i],"-n")==0||strcmp(argv[i],"--nogzip")==0) {
      *do_gzip = 0;
      continue;
    }
    if (argv[i][0]=='-') {
      printf("Error: Unknown argument: %s\n",argv[i]);
      exit(1);
    }
    if (!*infile) {
      *infile = argv[i];
      continue;
    }
    if (!*outfile) {
      *outfile = argv[i];
      continue;
    }
    printf("Error: Too many arguments! (run with -h or --help for usage instructions)\n");
    exit(1);
  }
  if (!*infile) {
    printf("Error: Too few arguments! (run with -h or --help for usage instructions)\n");
    exit(1);
  }
  if (!*outfile)
    *outfile = "output.mcpl";
  if (strcmp(*infile,*outfile)==0) {
    //basic test, easy to cheat:
    printf("Error: input and output files are identical.\n");
    exit(1);
  }
}